

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qapplication.cpp
# Opt level: O3

void QApplicationPrivate::setFocusWidget(QWidget *focus,FocusReason reason)

{
  QWidget *pQVar1;
  QWidget *pQVar2;
  QGraphicsProxyWidget *pQVar3;
  int *piVar4;
  QObject *pQVar5;
  long in_FS_OFFSET;
  QWidget *local_68;
  QWidget *local_60;
  undefined1 *local_58;
  QWidget **ppQStack_50;
  undefined1 *local_48;
  long local_38;
  
  pQVar2 = focus_widget;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (focus == (QWidget *)0x0) {
    hidden_focus_widget = (QWidget *)0x0;
    pQVar1 = hidden_focus_widget;
    if (focus_widget == (QWidget *)0x0) goto LAB_002bb6c5;
    focus_widget = (QWidget *)0x0;
  }
  else {
    pQVar2 = QWidget::window(focus);
    pQVar3 = QWidget::graphicsProxyWidget(pQVar2);
    pQVar1 = hidden_focus_widget;
    if (((pQVar3 != (QGraphicsProxyWidget *)0x0) ||
        (hidden_focus_widget = (QWidget *)0x0, pQVar1 = hidden_focus_widget, focus_widget == focus))
       || (pQVar1 = focus, (focus->data->widget_attributes & 0x10000) != 0)) goto LAB_002bb6c5;
    if (reason - TabFocusReason < 2) {
      if (qt_in_tab_key_event != false) {
LAB_002bb52f:
        pQVar2 = QWidget::window(focus);
        QWidget::setAttribute(pQVar2,WA_KeyboardFocusChange,true);
      }
    }
    else if (reason == ShortcutFocusReason) goto LAB_002bb52f;
    pQVar2 = focus_widget;
    focus_widget = focus;
    QWidgetPrivate::setFocus_sys(*(QWidgetPrivate **)&focus->field_0x8);
  }
  pQVar1 = hidden_focus_widget;
  if (reason != NoFocusReason) {
    if (pQVar2 != (QWidget *)0x0) {
      local_48 = &DAT_aaaaaaaaaaaaaaaa;
      local_58 = &DAT_aaaaaaaaaaaaaaaa;
      ppQStack_50 = (QWidget **)&DAT_aaaaaaaaaaaaaaaa;
      QFocusEvent::QFocusEvent((QFocusEvent *)&local_58,FocusOut,reason);
      piVar4 = (int *)QtSharedPointer::ExternalRefCountData::getAndRef(&pQVar2->super_QObject);
      QCoreApplication::sendEvent(&pQVar2->super_QObject,(QEvent *)&local_58);
      if (piVar4 != (int *)0x0) {
        if (piVar4[1] != 0) {
          pQVar5 = &QWidget::style(pQVar2)->super_QObject;
          QCoreApplication::sendEvent(pQVar5,(QEvent *)&local_58);
        }
        LOCK();
        *piVar4 = *piVar4 + -1;
        UNLOCK();
        if (*piVar4 == 0) {
          operator_delete(piVar4);
        }
      }
      QFocusEvent::~QFocusEvent((QFocusEvent *)&local_58);
    }
    if (focus_widget == focus && focus != (QWidget *)0x0) {
      local_48 = &DAT_aaaaaaaaaaaaaaaa;
      local_58 = &DAT_aaaaaaaaaaaaaaaa;
      ppQStack_50 = (QWidget **)&DAT_aaaaaaaaaaaaaaaa;
      QFocusEvent::QFocusEvent((QFocusEvent *)&local_58,FocusIn,reason);
      piVar4 = (int *)QtSharedPointer::ExternalRefCountData::getAndRef(&focus->super_QObject);
      QCoreApplication::sendEvent(&focus->super_QObject,(QEvent *)&local_58);
      if (piVar4 != (int *)0x0) {
        if (piVar4[1] != 0) {
          pQVar5 = &QWidget::style(focus)->super_QObject;
          QCoreApplication::sendEvent(pQVar5,(QEvent *)&local_58);
        }
        LOCK();
        *piVar4 = *piVar4 + -1;
        UNLOCK();
        if (*piVar4 == 0) {
          operator_delete(piVar4);
        }
      }
      QFocusEvent::~QFocusEvent((QFocusEvent *)&local_58);
    }
    ppQStack_50 = &local_60;
    local_68 = focus_widget;
    local_58 = (undefined1 *)0x0;
    local_60 = pQVar2;
    local_48 = (undefined1 *)&local_68;
    QMetaObject::activate(QCoreApplication::self,&QApplication::staticMetaObject,0,&local_58);
    pQVar1 = hidden_focus_widget;
  }
LAB_002bb6c5:
  hidden_focus_widget = pQVar1;
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QApplicationPrivate::setFocusWidget(QWidget *focus, Qt::FocusReason reason)
{
#if QT_CONFIG(graphicsview)
    if (focus && focus->window()->graphicsProxyWidget())
        return;
#endif

    hidden_focus_widget = nullptr;

    if (focus != focus_widget) {
        if (focus && focus->isHidden()) {
            hidden_focus_widget = focus;
            return;
        }

        if (focus && (reason == Qt::BacktabFocusReason || reason == Qt::TabFocusReason)
            && qt_in_tab_key_event)
            focus->window()->setAttribute(Qt::WA_KeyboardFocusChange);
        else if (focus && reason == Qt::ShortcutFocusReason) {
            focus->window()->setAttribute(Qt::WA_KeyboardFocusChange);
        }
        QWidget *prev = focus_widget;
        focus_widget = focus;

        if (focus_widget)
            focus_widget->d_func()->setFocus_sys();

        if (reason != Qt::NoFocusReason) {

            //send events
            if (prev) {
#ifdef QT_KEYPAD_NAVIGATION
                if (QApplicationPrivate::keyboardNavigationEnabled()) {
                    if (prev->hasEditFocus() && reason != Qt::PopupFocusReason)
                        prev->setEditFocus(false);
                }
#endif
                QFocusEvent out(QEvent::FocusOut, reason);
                QPointer<QWidget> that = prev;
                QCoreApplication::sendEvent(prev, &out);
                if (that)
                    QCoreApplication::sendEvent(that->style(), &out);
            }
            if (focus && QApplicationPrivate::focus_widget == focus) {
                QFocusEvent in(QEvent::FocusIn, reason);
                QPointer<QWidget> that = focus;
                QCoreApplication::sendEvent(focus, &in);
                if (that)
                    QCoreApplication::sendEvent(that->style(), &in);
            }
            emit qApp->focusChanged(prev, focus_widget);
        }
    }
}